

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O2

void __thiscall NaPNStatistics::relate_connectors(NaPNStatistics *this)

{
  NaVector *pNVar1;
  uint uVar2;
  undefined8 extraout_RDX;
  uint uVar3;
  
  uVar3 = 0;
  for (uVar2 = 0; uVar2 != 10; uVar2 = uVar2 + 1) {
    uVar3 = uVar3 + (((uint)this->mOutStat >> (uVar2 & 0x1f) & 1) != 0);
  }
  pNVar1 = NaPetriCnOutput::data(&this->stat);
  (*pNVar1->_vptr_NaVector[4])(pNVar1,(ulong)uVar3,extraout_RDX,pNVar1->_vptr_NaVector[4]);
  return;
}

Assistant:

void
NaPNStatistics::relate_connectors ()
{
    // n - number of needed statistics
    int	id, n = 0;
    for(id = 0; id < NaSI_number; ++id){
      if(mOutStat & NaSIdToMask(id))
	++n;
    }
    stat.data().new_dim(n);
}